

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O1

void __thiscall
btHingeConstraint::getInfo2InternalUsingFrameOffset
          (btHingeConstraint *this,btConstraintInfo2 *info,btTransform *transA,btTransform *transB,
          btVector3 *angVelA,btVector3 *angVelB)

{
  float *pfVar1;
  undefined8 uVar2;
  bool bVar3;
  btScalar *pbVar4;
  btScalar *pbVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  long lVar12;
  char cVar13;
  long lVar14;
  btScalar *pbVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  undefined4 uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [4];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  btScalar bVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 local_2c8 [16];
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [4];
  undefined1 auStack_2a4 [8];
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [12];
  undefined4 uStack_27c;
  undefined1 local_278 [16];
  undefined8 local_268;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  float local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [12];
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  float local_1b8;
  btScalar bStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  btScalar bStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  btVector3 *local_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  btScalar bStack_104;
  btScalar bStack_100;
  btScalar bStack_fc;
  float local_f8;
  btScalar bStack_f4;
  btScalar bStack_f0;
  btScalar bStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  btScalar bStack_c4;
  btScalar bStack_c0;
  btScalar bStack_bc;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar24 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[2];
  fVar40 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
  fVar26 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
  fVar17 = (transA->m_basis).m_el[2].m_floats[0];
  _local_248 = ZEXT416((uint)fVar17);
  fVar35 = (transA->m_basis).m_el[2].m_floats[1];
  _local_1e8 = ZEXT416((uint)fVar35);
  fVar18 = (transA->m_basis).m_el[2].m_floats[2];
  _local_238 = ZEXT416((uint)fVar18);
  fVar22 = ((this->super_btTypedConstraint).m_rbA)->m_inverseMass;
  fVar25 = ((this->super_btTypedConstraint).m_rbB)->m_inverseMass;
  local_298 = (float)-(uint)(1.1920929e-07 <= fVar22 && 1.1920929e-07 <= fVar25);
  fStack_294 = -NAN;
  fStack_290 = -NAN;
  fStack_28c = -NAN;
  fVar22 = fVar22 + fVar25;
  uVar16 = -(uint)(0.0 < fVar22);
  local_228 = (float)(~uVar16 & 0x3f000000 | (uint)(fVar25 / fVar22) & uVar16);
  fVar22 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[2];
  fVar25 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[2];
  fVar37 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[2];
  fVar38 = (transB->m_basis).m_el[2].m_floats[1];
  fVar39 = (transB->m_basis).m_el[2].m_floats[0];
  fVar30 = (transB->m_basis).m_el[2].m_floats[2];
  local_58 = fVar18 * fVar26 + fVar17 * fVar24 + fVar35 * fVar40;
  fStack_54 = fVar30 * fVar37 + fVar39 * fVar25 + fVar38 * fVar22;
  fStack_50 = (this->m_rbAFrame).m_origin.m_floats[0] * 0.0 +
              (this->m_rbAFrame).m_basis.m_el[1].m_floats[0] * 0.0 +
              (this->m_rbAFrame).m_basis.m_el[2].m_floats[0] * 0.0;
  fStack_4c = (this->m_rbAFrame).m_origin.m_floats[1] * 0.0 +
              (this->m_rbAFrame).m_basis.m_el[1].m_floats[1] * 0.0 +
              (this->m_rbAFrame).m_basis.m_el[2].m_floats[1] * 0.0;
  pbVar15 = (transA->m_basis).m_el[0].m_floats + 1;
  local_118 = *pbVar15;
  local_268 = *(btVector3 **)pbVar15;
  fStack_260 = (transA->m_basis).m_el[0].m_floats[3];
  fStack_25c = (transA->m_basis).m_el[1].m_floats[0];
  fStack_114 = (transA->m_basis).m_el[1].m_floats[1];
  local_1b8 = (transA->m_basis).m_el[0].m_floats[0];
  bStack_1b4 = (transA->m_basis).m_el[0].m_floats[1];
  fStack_1b0 = (transA->m_basis).m_el[0].m_floats[2];
  fStack_1ac = (transA->m_basis).m_el[0].m_floats[3];
  fStack_124 = (transA->m_basis).m_el[1].m_floats[0];
  local_1a8 = (transA->m_basis).m_el[0].m_floats[2];
  bStack_1a4 = (transA->m_basis).m_el[0].m_floats[3];
  fStack_1a0 = (transA->m_basis).m_el[1].m_floats[0];
  fStack_19c = (transA->m_basis).m_el[1].m_floats[1];
  fStack_134 = (transA->m_basis).m_el[1].m_floats[2];
  local_48 = fVar26 * local_1a8 + fVar24 * local_1b8 + fVar40 * local_118;
  fStack_44 = fVar26 * fStack_134 + fVar24 * fStack_124 + fVar40 * fStack_114;
  fStack_40 = fVar26 * fStack_1a0 + fVar24 * fStack_1b0 + fVar40 * fStack_260;
  fStack_3c = fVar26 * fStack_19c + fVar24 * fStack_1ac + fVar40 * fStack_25c;
  fVar24 = (transB->m_basis).m_el[0].m_floats[1];
  fVar40 = (transB->m_basis).m_el[1].m_floats[1];
  local_98 = ZEXT416((uint)fVar24);
  fVar26 = (transB->m_basis).m_el[0].m_floats[0];
  fVar20 = (transB->m_basis).m_el[1].m_floats[0];
  local_1c8 = ZEXT416((uint)fVar26);
  fVar21 = (transB->m_basis).m_el[0].m_floats[2];
  fVar23 = (transB->m_basis).m_el[1].m_floats[2];
  local_78 = ZEXT416((uint)fVar21);
  local_68 = fVar21 * fVar37 + fVar26 * fVar25 + fVar24 * fVar22;
  fStack_64 = fVar23 * fVar37 + fVar20 * fVar25 + fVar40 * fVar22;
  fStack_60 = fVar37 * 0.0 + fVar25 * 0.0 + fVar22 * 0.0;
  fStack_5c = fVar37 * 0.0 + fVar25 * 0.0 + fVar22 * 0.0;
  local_198 = 1.0 - local_228;
  local_258._0_4_ = local_68 * local_198 + local_48 * local_228;
  local_2a8 = (undefined1  [4])(fStack_64 * local_198 + fStack_44 * local_228);
  uStack_224 = 0;
  uStack_220 = 0;
  uStack_21c = 0;
  _local_1f8 = ZEXT416((uint)local_198);
  auStack_2a4._0_4_ = local_198 * fStack_54 + local_228 * local_58;
  iVar10 = info->rowskip;
  local_158 = ZEXT416((uint)(this->m_rbAFrame).m_basis.m_el[0].m_floats[1]);
  local_168 = ZEXT416((uint)(this->m_rbAFrame).m_basis.m_el[1].m_floats[1]);
  local_148 = ZEXT416((uint)(this->m_rbAFrame).m_basis.m_el[2].m_floats[1]);
  local_f8 = (this->m_rbAFrame).m_origin.m_floats[0];
  bStack_f4 = (this->m_rbAFrame).m_origin.m_floats[1];
  bStack_f0 = (this->m_rbAFrame).m_origin.m_floats[2];
  bStack_ec = (this->m_rbAFrame).m_origin.m_floats[3];
  local_108 = (this->m_rbAFrame).m_origin.m_floats[1];
  bStack_104 = (this->m_rbAFrame).m_origin.m_floats[2];
  bStack_100 = (this->m_rbAFrame).m_origin.m_floats[3];
  bStack_fc = (this->m_rbBFrame).m_basis.m_el[0].m_floats[0];
  local_c8 = (this->m_rbAFrame).m_origin.m_floats[2];
  bStack_c4 = (this->m_rbAFrame).m_origin.m_floats[3];
  bStack_c0 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[0];
  bStack_bc = (this->m_rbBFrame).m_basis.m_el[0].m_floats[1];
  local_a8 = *(undefined8 *)(transA->m_origin).m_floats;
  uStack_a0 = *(undefined8 *)((transA->m_origin).m_floats + 2);
  fVar22 = (this->m_rbBFrame).m_origin.m_floats[0];
  local_e8 = ZEXT416((uint)fVar22);
  fVar25 = (this->m_rbBFrame).m_origin.m_floats[1];
  fVar37 = (this->m_rbBFrame).m_origin.m_floats[2];
  local_b8 = ZEXT416((uint)fVar37);
  bVar43 = (transB->m_origin).m_floats[0];
  auVar8._4_4_ = local_2a8;
  auVar8._0_4_ = local_258._0_4_;
  auVar8._8_4_ = auStack_2a4._0_4_;
  auVar7._12_4_ = 0;
  auVar7._0_12_ = auVar8;
  uVar2 = *(undefined8 *)((transA->m_origin).m_floats + 1);
  local_2b8 = (float)uVar2 + fStack_134 * local_c8 + fStack_124 * local_f8 + local_108 * fStack_114;
  fStack_2b4 = (float)((ulong)uVar2 >> 0x20) +
               fVar18 * local_c8 + fVar17 * local_f8 + local_108 * fVar35;
  fStack_2b0 = local_c8 * 0.0 + local_f8 * 0.0 + local_108 * 0.0 + 0.0;
  fStack_2ac = local_c8 * 0.0 + local_f8 * 0.0 + local_108 * 0.0 + 0.0;
  local_278._4_8_ = auVar8._4_8_;
  auStack_2a4._4_4_ = 0.0;
  fStack_29c = 0.0;
  local_258._4_4_ = 0;
  local_258._8_4_ = 0;
  local_258._12_4_ = 0;
  fVar17 = (float)auStack_2a4._0_4_ * (float)auStack_2a4._0_4_ +
           (float)local_258._0_4_ * (float)local_258._0_4_ + (float)local_2a8 * (float)local_2a8;
  local_d8 = ZEXT416((uint)fVar25);
  uVar2 = *(undefined8 *)((transB->m_origin).m_floats + 1);
  local_88 = (float)uVar2 + fVar23 * fVar37 + fVar20 * fVar22 + fVar25 * fVar40;
  fStack_84 = (float)((ulong)uVar2 >> 0x20) + fVar30 * fVar37 + fVar39 * fVar22 + fVar25 * fVar38;
  fStack_80 = fVar37 * 0.0 + fVar22 * 0.0 + fVar25 * 0.0 + 0.0;
  fStack_7c = fVar37 * 0.0 + fVar22 * 0.0 + fVar25 * 0.0 + 0.0;
  local_178 = local_88 - local_2b8;
  fStack_174 = fStack_84 - fStack_2b4;
  fStack_170 = fStack_80 - fStack_2b0;
  fStack_16c = fStack_7c - fStack_2ac;
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  local_180 = angVelA;
  local_138 = local_1a8;
  fStack_130 = fStack_1a0;
  fStack_12c = fStack_19c;
  local_128 = local_1b8;
  fStack_120 = fStack_1b0;
  fStack_11c = fStack_1ac;
  fStack_110 = fStack_260;
  fStack_10c = fStack_25c;
  local_208._0_4_ = local_228;
  local_208._4_4_ = local_228;
  uStack_200._0_4_ = local_228;
  uStack_200._4_4_ = local_228;
  if (fVar17 < 0.0) {
    stack0xfffffffffffffd60 = 0;
    _local_2a8 = local_278._4_8_;
    local_258 = ZEXT416((uint)local_258._0_4_);
    _local_1d8 = ZEXT416((uint)bVar43);
    local_278 = auVar7;
    fVar17 = sqrtf(fVar17);
    bVar43 = (btScalar)local_1d8._0_4_;
  }
  else {
    fVar17 = SQRT(fVar17);
    local_278 = auVar7;
  }
  auVar7 = local_278;
  fVar35 = local_298;
  fVar17 = 1.0 / fVar17;
  fVar38 = (float)local_258._0_4_ * fVar17;
  auVar36 = (undefined1  [4])((float)local_2a8 * fVar17);
  fVar37 = (float)auStack_2a4._0_4_ * fVar17;
  auStack_2a4._4_4_ = (float)auStack_2a4._4_4_ * fVar17;
  fStack_29c = fStack_29c * fVar17;
  local_278._8_4_ = fVar37;
  local_278._4_4_ = auVar36;
  local_278._12_4_ = auVar7._12_4_;
  local_278._0_4_ = fVar38;
  uVar2 = *(undefined8 *)((transB->m_origin).m_floats + 1);
  fVar44 = local_88 - (float)uVar2;
  fVar45 = fStack_84 - (float)((ulong)uVar2 >> 0x20);
  uVar2 = *(undefined8 *)((transA->m_origin).m_floats + 1);
  local_2b8 = local_2b8 - (float)uVar2;
  fVar31 = fStack_2b4 - (float)((ulong)uVar2 >> 0x20);
  fVar33 = fStack_2b0 - 0.0;
  fVar34 = fStack_2ac - 0.0;
  fVar40 = (float)local_a8 +
           local_1a8 * local_c8 + local_1b8 * local_f8 + local_108 * (float)local_268;
  fVar17 = bVar43 + (float)local_78._0_4_ * (float)local_b8._0_4_ +
                    (float)local_1c8._0_4_ * (float)local_e8._0_4_ +
                    (float)local_d8._0_4_ * (float)local_98._0_4_;
  fVar41 = (float)uStack_a0 +
           fStack_1a0 * bStack_c0 + fStack_1b0 * bStack_f0 + bStack_100 * fStack_260;
  fVar42 = uStack_a0._4_4_ +
           fStack_19c * bStack_bc + fStack_1ac * bStack_ec + bStack_fc * fStack_25c;
  fVar18 = fVar40 - (transA->m_origin).m_floats[0];
  fStack_294 = fVar17 - (transB->m_origin).m_floats[0];
  fVar20 = fVar41 - (transA->m_origin).m_floats[2];
  fVar21 = fVar42 - (transA->m_origin).m_floats[3];
  fVar23 = fVar31 * fVar37 + fVar18 * fVar38 + local_2b8 * (float)auVar36;
  fVar25 = fVar45 * fVar37 + fStack_294 * fVar38 + fVar44 * (float)auVar36;
  fVar44 = fVar44 - fVar25 * (float)auVar36;
  fVar46 = fVar45 - fVar25 * fVar37;
  fVar18 = fVar18 - fVar38 * fVar23;
  fStack_294 = fStack_294 - fVar38 * fVar25;
  fVar30 = local_2b8 - fVar23 * (float)auVar36;
  fVar32 = fVar31 - fVar23 * fVar37;
  fVar22 = fVar38 * fVar23 - fVar38 * fVar25;
  fVar24 = fVar23 * (float)auVar36 - fVar25 * (float)auVar36;
  fVar26 = fVar23 * fVar37 - fVar25 * fVar37;
  fVar27 = fVar23 * (float)auStack_2a4._4_4_ - fVar25 * (float)auStack_2a4._4_4_;
  fVar28 = fVar23 * fStack_29c - fVar25 * fStack_29c;
  fVar39 = local_228 * fVar22 + fVar18;
  fVar29 = local_228 * fStack_294;
  local_298 = fStack_294 - fVar22 * (float)local_1f8._0_4_;
  fStack_2b4 = fVar46 - fVar26 * fStack_194;
  local_2b8 = fVar44 - fVar24 * local_198;
  fStack_2b0 = ((fStack_80 - 0.0) - fVar25 * (float)auStack_2a4._4_4_) - fVar27 * fStack_190;
  fStack_2ac = ((fStack_7c - 0.0) - fVar25 * fStack_29c) - fVar28 * fStack_18c;
  fVar22 = fVar29 + (float)local_1f8._0_4_ * fVar18;
  fVar25 = (float)local_1f8._0_4_ * fVar30 + local_228 * fVar44;
  fVar30 = (float)local_208 * fVar24 + fVar30;
  fVar24 = local_208._4_4_ * fVar26 + fVar32;
  fVar18 = fVar32 * (float)local_1f8._0_4_ + fVar46 * local_228;
  local_1b8 = fStack_174;
  bStack_1b4 = fStack_174;
  fStack_1b0 = fStack_174;
  fStack_1ac = fStack_174;
  local_288._4_4_ = fVar25;
  local_288._0_4_ = fVar22;
  local_288._8_4_ = fVar18;
  uStack_27c = 0;
  fVar26 = fVar18 * fVar18 + fVar22 * fVar22 + fVar25 * fVar25;
  auStack_2a4._0_4_ = fVar37;
  local_2a8 = auVar36;
  local_258._0_4_ = fVar38;
  local_268 = (btVector3 *)CONCAT44(uStack_224,fVar39);
  fStack_260 = (float)uStack_220;
  fStack_25c = (float)uStack_21c;
  local_238._4_4_ = fVar17;
  fStack_230 = fVar17;
  fStack_22c = fVar17;
  fStack_290 = fStack_294;
  fStack_28c = fStack_294;
  local_1a8 = fVar37;
  bStack_1a4 = fVar37;
  fStack_1a0 = fVar37;
  fStack_19c = fVar37;
  if (fVar26 <= 1.1920929e-07) {
    local_288._4_4_ =
         (float)local_148._0_4_ * fStack_134 +
         (float)local_158._0_4_ * fStack_124 + (float)local_168._0_4_ * fStack_114;
    local_288._0_4_ =
         (float)local_148._0_4_ * local_138 +
         (float)local_158._0_4_ * local_128 + (float)local_168._0_4_ * local_118;
    local_288._8_4_ =
         (float)local_238._0_4_ * (float)local_148._0_4_ +
         (float)local_248._0_4_ * (float)local_158._0_4_ +
         (float)local_1e8._0_4_ * (float)local_168._0_4_;
    uStack_27c = 0;
  }
  else {
    if (fVar26 < 0.0) {
      local_238._0_4_ = fVar17;
      local_248._4_4_ = fVar24;
      local_248._0_4_ = fVar30;
      fStack_240 = (float)uStack_200 * fVar27 + (fVar33 - fVar23 * (float)auStack_2a4._4_4_);
      fStack_23c = uStack_200._4_4_ * fVar28 + (fVar34 - fVar23 * fStack_29c);
      local_1d8._4_4_ = fVar17;
      local_1d8._0_4_ = fVar40;
      fStack_1d0 = fVar41;
      fStack_1cc = fVar42;
      local_1e8._4_4_ = fVar25;
      local_1e8._0_4_ = fVar22;
      fStack_1e0 = fVar29 + (float)local_1f8._8_4_ *
                            (fVar20 - fVar38 * (fVar33 * fVar37 +
                                               fVar20 * fVar38 + fVar31 * (float)auVar36));
      fStack_1dc = fVar29 + fStack_1ec *
                            (fVar21 - fVar38 * (fVar34 * fVar37 +
                                               fVar21 * fVar38 + fVar45 * (float)auVar36));
      local_1c8._0_4_ = fVar18;
      fVar26 = sqrtf(fVar26);
      fVar18 = (float)local_1c8._0_4_;
      fVar22 = (float)local_1e8._0_4_;
      fVar25 = (float)local_1e8._4_4_;
      auVar36 = local_2a8;
      fVar37 = (float)auStack_2a4._0_4_;
      fVar38 = (float)local_258._0_4_;
      fVar39 = (float)local_268;
      fVar40 = (float)local_1d8._0_4_;
    }
    else {
      fVar26 = SQRT(fVar26);
      local_238._0_4_ = fVar17;
      local_248._0_4_ = fVar30;
      local_248._4_4_ = fVar24;
      uStack_27c = 0;
    }
    fVar26 = 1.0 / fVar26;
    local_288._4_4_ = fVar25 * fVar26;
    local_288._0_4_ = fVar22 * fVar26;
    local_288._8_4_ = fVar18 * fVar26;
    fVar17 = (float)local_238._0_4_;
    fVar30 = (float)local_248._0_4_;
    fVar24 = (float)local_248._4_4_;
  }
  local_238._0_4_ = fVar17 - fVar40;
  uVar19 = local_288._0_4_;
  fVar17 = local_288._4_4_;
  fVar18 = local_288._8_4_;
  fVar22 = (float)auVar36 * fVar18 - fVar17 * fVar37;
  fVar25 = fVar37 * (float)local_288._0_4_ - fVar18 * fVar38;
  fVar40 = fVar38 * fVar17 - (float)local_288._0_4_ * (float)auVar36;
  uVar6 = CONCAT44(fVar25,fVar22);
  local_218._8_4_ = fVar40;
  local_218._0_8_ = uVar6;
  local_218._12_4_ = 0;
  local_2c8._4_4_ = (float)local_288._0_4_ * fStack_2b4 - fVar18 * local_298;
  local_2c8._0_4_ = fVar18 * local_2b8 - fVar17 * fStack_2b4;
  local_2c8._8_4_ = local_298 * fVar17 - (float)local_288._0_4_ * local_2b8;
  local_2c8._12_4_ = 0;
  pbVar15 = info->m_J1angularAxis;
  *(ulong *)pbVar15 =
       CONCAT44(fVar24 * (float)local_288._0_4_ - fVar18 * fVar39,fVar30 * fVar18 - fVar17 * fVar24)
  ;
  pbVar15[2] = fVar39 * fVar17 - (float)local_288._0_4_ * fVar30;
  pbVar15 = info->m_J2angularAxis;
  lVar12 = 0;
  do {
    pbVar15[lVar12] = -*(btScalar *)(local_2c8 + lVar12 * 4);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  _local_248 = ZEXT416((uint)fVar40);
  fVar26 = fVar30 * fVar40 + fVar25 * -fVar24;
  fVar20 = fVar24 * fVar22 + fVar40 * -fVar39;
  fVar21 = (float)local_268 * fVar25 + fVar22 * -fVar30;
  fVar23 = fVar40 * local_2b8 + fVar25 * -fStack_2b4;
  fVar27 = fVar22 * fStack_2b4 + fVar40 * -local_298;
  fVar28 = local_298 * fVar25 + fVar22 * -local_2b8;
  local_2c8._4_4_ = fVar27;
  local_2c8._0_4_ = fVar23;
  local_2c8._8_4_ = fVar28;
  local_2c8._12_4_ = 0;
  if ((this->m_limit).m_solveLimit != false && ((uint)fVar35 & 1) == 0) {
    local_2c8._4_4_ = fVar27 * fStack_194;
    local_2c8._0_4_ = fVar23 * local_198;
    local_2c8._8_4_ = fVar28 * (float)local_1f8._0_4_;
    local_2c8._12_4_ = 0;
    fVar26 = fVar26 * (float)local_208;
    fVar20 = fVar20 * local_208._4_4_;
    fVar21 = fVar21 * local_228;
  }
  pbVar15 = info->m_J1angularAxis;
  *(ulong *)(pbVar15 + iVar10) = CONCAT44(fVar20,fVar26);
  pbVar15[(long)iVar10 + 2] = fVar21;
  pbVar15 = info->m_J2angularAxis;
  lVar12 = 0;
  do {
    pbVar15[iVar10 + lVar12] = -*(btScalar *)(local_2c8 + lVar12 * 4);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  fVar26 = fVar30 * fVar37 + -fVar24 * (float)local_2a8;
  fVar39 = fVar24 * fVar38 + -fVar39 * (float)auStack_2a4._0_4_;
  bVar43 = (float)local_268 * (float)local_2a8 + -fVar30 * (float)local_258._0_4_;
  fVar30 = local_2b8 * fVar37 + -fStack_2b4 * (float)local_2a8;
  fVar38 = fStack_2b4 * fVar38 + -local_298 * (float)auStack_2a4._0_4_;
  fVar37 = local_298 * (float)local_2a8 + -local_2b8 * (float)local_258._0_4_;
  local_2c8._4_4_ = fVar38;
  local_2c8._0_4_ = fVar30;
  local_2c8._8_4_ = fVar37;
  local_2c8._12_4_ = 0;
  if (((uint)fVar35 & 1) == 0) {
    local_2c8._4_4_ = fStack_194 * fVar38;
    local_2c8._0_4_ = local_198 * fVar30;
    local_2c8._8_4_ = (float)local_1f8._0_4_ * fVar37;
    local_2c8._12_4_ = 0;
    fVar26 = fVar26 * (float)local_208;
    fVar39 = fVar39 * local_208._4_4_;
    bVar43 = bVar43 * local_228;
  }
  pbVar15 = info->m_J1angularAxis;
  lVar12 = (long)(iVar10 * 2);
  *(ulong *)(pbVar15 + lVar12) = CONCAT44(fVar39,fVar26);
  pbVar15[lVar12 + 2] = bVar43;
  pbVar15 = info->m_J2angularAxis;
  lVar14 = 0;
  do {
    pbVar15[lVar12 + lVar14] = -*(btScalar *)(local_2c8 + lVar14 * 4);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  pbVar15 = &this->m_normalERP;
  if ((this->m_flags & 8) == 0) {
    pbVar15 = &info->erp;
  }
  local_298 = *pbVar15;
  if (this->m_angularOnly == false) {
    fVar35 = info->fps * local_298;
    pbVar15 = info->m_J1linearAxis;
    pbVar15[2] = fVar18;
    *(undefined8 *)pbVar15 = local_288._0_8_;
    pbVar15[(long)iVar10 + 2] = fVar40;
    *(ulong *)(pbVar15 + iVar10) = uVar6;
    pbVar15[lVar12 + 2] = (btScalar)local_278._8_4_;
    *(undefined8 *)(pbVar15 + lVar12) = local_278._0_8_;
    pbVar15 = info->m_J2linearAxis;
    lVar14 = 0;
    do {
      pbVar15[lVar14] = -*(btScalar *)(local_288 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    pbVar15 = info->m_J2linearAxis;
    lVar14 = 0;
    do {
      pbVar15[iVar10 + lVar14] = -*(btScalar *)(local_218 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    pbVar15 = info->m_J2linearAxis;
    lVar14 = 0;
    do {
      pbVar15[lVar12 + lVar14] = -*(btScalar *)(local_278 + lVar14 * 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    pbVar15 = info->m_constraintError;
    *pbVar15 = (fVar18 * local_1b8 + (float)uVar19 * (float)local_238._0_4_ + fVar17 * local_178) *
               fVar35;
    pbVar15[iVar10] =
         (fVar40 * local_1b8 + fVar22 * (float)local_238._0_4_ + local_178 * fVar25) * fVar35;
    pbVar15[lVar12] =
         (local_1a8 * local_1b8 +
         (float)local_258._0_4_ * (float)local_238._0_4_ + (float)local_2a8 * local_178) * fVar35;
  }
  iVar11 = iVar10 * 4;
  pbVar15 = info->m_J1angularAxis;
  lVar12 = (long)(iVar10 * 3);
  pbVar15[lVar12] = (btScalar)uVar19;
  pbVar15[lVar12 + 1] = fVar17;
  pbVar15[lVar12 + 2] = fVar18;
  *(ulong *)(pbVar15 + iVar11) = uVar6;
  iVar10 = iVar10 * 4 + 2;
  pbVar15[iVar10] = fVar40;
  pbVar4 = info->m_J2angularAxis;
  pbVar4[lVar12] = -(float)uVar19;
  pbVar4[lVar12 + 1] = -fVar17;
  pbVar4[lVar12 + 2] = -fVar18;
  *(ulong *)(pbVar4 + iVar11) = uVar6 ^ 0x8000000080000000;
  pbVar4[iVar10] = -fVar40;
  fVar38 = fStack_44 * fStack_54 - fStack_64 * local_58;
  fVar39 = local_58 * local_68 - fStack_54 * local_48;
  fVar37 = fStack_64 * local_48 - fStack_44 * local_68;
  fVar35 = info->fps * local_298;
  pbVar5 = info->m_constraintError;
  pbVar5[lVar12] = (fVar18 * fVar37 + (float)uVar19 * fVar38 + fVar39 * fVar17) * fVar35;
  pbVar5[iVar11] = (fVar37 * fVar40 + fVar38 * fVar22 + fVar39 * fVar25) * fVar35;
  if ((this->m_limit).m_solveLimit == false) {
    auVar9._12_4_ = 0;
    auVar9._0_12_ = _auStack_2a4;
    _local_2a8 = auVar9 << 0x20;
    cVar13 = '\0';
  }
  else {
    local_2a8 = (undefined1  [4])((this->m_limit).m_correction * this->m_referenceSign);
    cVar13 = ((float)local_2a8 <= 0.0) + '\x01';
  }
  bVar3 = this->m_enableAngularMotor;
  if ((cVar13 == '\0' & (bVar3 ^ 1U)) != 0) {
    return;
  }
  iVar10 = info->rowskip;
  lVar12 = (long)iVar10;
  *(undefined8 *)(pbVar15 + lVar12 * 5) = local_278._0_8_;
  _local_1f8 = ZEXT416((uint)local_278._8_4_);
  lVar14 = (long)(iVar10 * 5);
  pbVar15[lVar14 + 2] = (btScalar)local_278._8_4_;
  local_208 = local_278._0_8_;
  uStack_200 = 0;
  *(ulong *)(pbVar4 + lVar12 * 5) = local_278._0_8_ ^ 0x8000000080000000;
  pbVar4[lVar14 + 2] = -(float)local_278._8_4_;
  local_258._0_8_ = info;
  local_268 = angVelB;
  bVar43 = btAngularLimit::getLow(&this->m_limit);
  local_2b8 = bVar43;
  local_228 = btAngularLimit::getHigh(&this->m_limit);
  *(undefined4 *)(*(long *)(local_258._0_8_ + 0x30) + lVar12 * 0x14) = 0;
  if ((this->m_flags & 2U) != 0) {
    local_298 = this->m_stopERP;
  }
  if ((bVar3 != false) && (cVar13 == '\0' || local_2b8 != local_228)) {
    if ((this->m_flags & 4U) != 0) {
      *(btScalar *)(*(long *)(local_258._0_8_ + 0x38) + lVar12 * 0x14) = this->m_normalCFM;
    }
    bVar43 = btTypedConstraint::getMotorFactor
                       (&this->super_btTypedConstraint,this->m_hingeAngle,local_2b8,local_228,
                        this->m_motorTargetVelocity,*(float *)local_258._0_8_ * local_298);
    *(float *)(*(long *)(local_258._0_8_ + 0x30) + lVar12 * 0x14) =
         bVar43 * this->m_motorTargetVelocity * this->m_referenceSign +
         *(float *)(*(long *)(local_258._0_8_ + 0x30) + lVar12 * 0x14);
    *(float *)(*(long *)(local_258._0_8_ + 0x40) + lVar12 * 0x14) = -this->m_maxMotorImpulse;
    *(btScalar *)(*(long *)(local_258._0_8_ + 0x48) + lVar12 * 0x14) = this->m_maxMotorImpulse;
  }
  if (cVar13 == '\0') {
    return;
  }
  lVar14 = *(long *)(local_258._0_8_ + 0x30);
  *(float *)(lVar14 + lVar12 * 0x14) =
       local_298 * *(float *)local_258._0_8_ * (float)local_2a8 + *(float *)(lVar14 + lVar12 * 0x14)
  ;
  if ((this->m_flags & 1) != 0) {
    *(btScalar *)(*(long *)(local_258._0_8_ + 0x38) + lVar12 * 0x14) = this->m_stopCFM;
  }
  if ((local_2b8 != local_228) || (NAN(local_2b8) || NAN(local_228))) {
    if (cVar13 == '\x01') {
      *(undefined4 *)(*(long *)(local_258._0_8_ + 0x40) + lVar12 * 0x14) = 0;
      goto LAB_0019d9bc;
    }
    *(undefined4 *)(*(long *)(local_258._0_8_ + 0x40) + lVar12 * 0x14) = 0xff7fffff;
    uVar19 = 0;
  }
  else {
    *(undefined4 *)(*(long *)(local_258._0_8_ + 0x40) + lVar12 * 0x14) = 0xff7fffff;
LAB_0019d9bc:
    uVar19 = 0x7f7fffff;
  }
  *(undefined4 *)(*(long *)(local_258._0_8_ + 0x48) + lVar12 * 0x14) = uVar19;
  fVar17 = (this->m_limit).m_relaxationFactor;
  if (0.0 < fVar17) {
    fVar35 = (local_180->m_floats[2] * (float)local_1f8._0_4_ +
             local_180->m_floats[0] * (float)local_208 + local_180->m_floats[1] * local_208._4_4_) -
             ((float)local_1f8._0_4_ * local_268->m_floats[2] +
             local_268->m_floats[0] * (float)local_208 + local_208._4_4_ * local_268->m_floats[1]);
    if (cVar13 == '\x01') {
      if ((0.0 <= fVar35) ||
         (fVar35 = fVar35 * -fVar17, pfVar1 = (float *)(lVar14 + lVar12 * 0x14),
         fVar35 < *pfVar1 || fVar35 == *pfVar1)) goto LAB_0019da83;
    }
    else if ((fVar35 <= 0.0) ||
            (fVar35 = fVar35 * -fVar17, *(float *)(lVar14 + lVar12 * 0x14) <= fVar35))
    goto LAB_0019da83;
    *(float *)(lVar14 + lVar12 * 0x14) = fVar35;
  }
LAB_0019da83:
  *(float *)(lVar14 + lVar12 * 0x14) =
       (this->m_limit).m_biasFactor * *(float *)(lVar14 + lVar12 * 0x14);
  return;
}

Assistant:

void btHingeConstraint::getInfo2InternalUsingFrameOffset(btConstraintInfo2* info, const btTransform& transA,const btTransform& transB,const btVector3& angVelA,const btVector3& angVelB)
{
	btAssert(!m_useSolveConstraintObsolete);
	int i, s = info->rowskip;
	// transforms in world space
	btTransform trA = transA*m_rbAFrame;
	btTransform trB = transB*m_rbBFrame;
	// pivot point
//	btVector3 pivotAInW = trA.getOrigin();
//	btVector3 pivotBInW = trB.getOrigin();
#if 1
	// difference between frames in WCS
	btVector3 ofs = trB.getOrigin() - trA.getOrigin();
	// now get weight factors depending on masses
	btScalar miA = getRigidBodyA().getInvMass();
	btScalar miB = getRigidBodyB().getInvMass();
	bool hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
	btScalar miS = miA + miB;
	btScalar factA, factB;
	if(miS > btScalar(0.f))
	{
		factA = miB / miS;
	}
	else 
	{
		factA = btScalar(0.5f);
	}
	factB = btScalar(1.0f) - factA;
	// get the desired direction of hinge axis
	// as weighted sum of Z-orthos of frameA and frameB in WCS
	btVector3 ax1A = trA.getBasis().getColumn(2);
	btVector3 ax1B = trB.getBasis().getColumn(2);
	btVector3 ax1 = ax1A * factA + ax1B * factB;
	ax1.normalize();
	// fill first 3 rows 
	// we want: velA + wA x relA == velB + wB x relB
	btTransform bodyA_trans = transA;
	btTransform bodyB_trans = transB;
	int s0 = 0;
	int s1 = s;
	int s2 = s * 2;
	int nrow = 2; // last filled row
	btVector3 tmpA, tmpB, relA, relB, p, q;
	// get vector from bodyB to frameB in WCS
	relB = trB.getOrigin() - bodyB_trans.getOrigin();
	// get its projection to hinge axis
	btVector3 projB = ax1 * relB.dot(ax1);
	// get vector directed from bodyB to hinge axis (and orthogonal to it)
	btVector3 orthoB = relB - projB;
	// same for bodyA
	relA = trA.getOrigin() - bodyA_trans.getOrigin();
	btVector3 projA = ax1 * relA.dot(ax1);
	btVector3 orthoA = relA - projA;
	btVector3 totalDist = projA - projB;
	// get offset vectors relA and relB
	relA = orthoA + totalDist * factA;
	relB = orthoB - totalDist * factB;
	// now choose average ortho to hinge axis
	p = orthoB * factA + orthoA * factB;
	btScalar len2 = p.length2();
	if(len2 > SIMD_EPSILON)
	{
		p /= btSqrt(len2);
	}
	else
	{
		p = trA.getBasis().getColumn(1);
	}
	// make one more ortho
	q = ax1.cross(p);
	// fill three rows
	tmpA = relA.cross(p);
	tmpB = relB.cross(p);
    for (i=0; i<3; i++) info->m_J1angularAxis[s0+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s0+i] = -tmpB[i];
	tmpA = relA.cross(q);
	tmpB = relB.cross(q);
	if(hasStaticBody && getSolveLimit())
	{ // to make constraint between static and dynamic objects more rigid
		// remove wA (or wB) from equation if angular limit is hit
		tmpB *= factB;
		tmpA *= factA;
	}
	for (i=0; i<3; i++) info->m_J1angularAxis[s1+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s1+i] = -tmpB[i];
	tmpA = relA.cross(ax1);
	tmpB = relB.cross(ax1);
	if(hasStaticBody)
	{ // to make constraint between static and dynamic objects more rigid
		// remove wA (or wB) from equation
		tmpB *= factB;
		tmpA *= factA;
	}
	for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = -tmpB[i];

	btScalar normalErp = (m_flags & BT_HINGE_FLAGS_ERP_NORM)? m_normalERP : info->erp;
	btScalar k = info->fps * normalErp;

	if (!m_angularOnly)
	{
		for (i=0; i<3; i++) info->m_J1linearAxis[s0+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s1+i] = q[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = ax1[i];

		for (i=0; i<3; i++) info->m_J2linearAxis[s0+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s1+i] = -q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -ax1[i];

	// compute three elements of right hand side
	
		btScalar rhs = k * p.dot(ofs);
		info->m_constraintError[s0] = rhs;
		rhs = k * q.dot(ofs);
		info->m_constraintError[s1] = rhs;
		rhs = k * ax1.dot(ofs);
		info->m_constraintError[s2] = rhs;
	}
	// the hinge axis should be the only unconstrained
	// rotational axis, the angular velocity of the two bodies perpendicular to
	// the hinge axis should be equal. thus the constraint equations are
	//    p*w1 - p*w2 = 0
	//    q*w1 - q*w2 = 0
	// where p and q are unit vectors normal to the hinge axis, and w1 and w2
	// are the angular velocity vectors of the two bodies.
	int s3 = 3 * s;
	int s4 = 4 * s;
	info->m_J1angularAxis[s3 + 0] = p[0];
	info->m_J1angularAxis[s3 + 1] = p[1];
	info->m_J1angularAxis[s3 + 2] = p[2];
	info->m_J1angularAxis[s4 + 0] = q[0];
	info->m_J1angularAxis[s4 + 1] = q[1];
	info->m_J1angularAxis[s4 + 2] = q[2];

	info->m_J2angularAxis[s3 + 0] = -p[0];
	info->m_J2angularAxis[s3 + 1] = -p[1];
	info->m_J2angularAxis[s3 + 2] = -p[2];
	info->m_J2angularAxis[s4 + 0] = -q[0];
	info->m_J2angularAxis[s4 + 1] = -q[1];
	info->m_J2angularAxis[s4 + 2] = -q[2];
	// compute the right hand side of the constraint equation. set relative
	// body velocities along p and q to bring the hinge back into alignment.
	// if ax1A,ax1B are the unit length hinge axes as computed from bodyA and
	// bodyB, we need to rotate both bodies along the axis u = (ax1 x ax2).
	// if "theta" is the angle between ax1 and ax2, we need an angular velocity
	// along u to cover angle erp*theta in one step :
	//   |angular_velocity| = angle/time = erp*theta / stepsize
	//                      = (erp*fps) * theta
	//    angular_velocity  = |angular_velocity| * (ax1 x ax2) / |ax1 x ax2|
	//                      = (erp*fps) * theta * (ax1 x ax2) / sin(theta)
	// ...as ax1 and ax2 are unit length. if theta is smallish,
	// theta ~= sin(theta), so
	//    angular_velocity  = (erp*fps) * (ax1 x ax2)
	// ax1 x ax2 is in the plane space of ax1, so we project the angular
	// velocity to p and q to find the right hand side.
	k = info->fps * normalErp;//??

	btVector3 u = ax1A.cross(ax1B);
	info->m_constraintError[s3] = k * u.dot(p);
	info->m_constraintError[s4] = k * u.dot(q);
#endif
	// check angular limits
	nrow = 4; // last filled row
	int srow;
	btScalar limit_err = btScalar(0.0);
	int limit = 0;
	if(getSolveLimit())
	{
#ifdef	_BT_USE_CENTER_LIMIT_
	limit_err = m_limit.getCorrection() * m_referenceSign;
#else
	limit_err = m_correction * m_referenceSign;
#endif
	limit = (limit_err > btScalar(0.0)) ? 1 : 2;

	}
	// if the hinge has joint limits or motor, add in the extra row
	int powered = 0;
	if(getEnableAngularMotor())
	{
		powered = 1;
	}
	if(limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1angularAxis[srow+0] = ax1[0];
		info->m_J1angularAxis[srow+1] = ax1[1];
		info->m_J1angularAxis[srow+2] = ax1[2];

		info->m_J2angularAxis[srow+0] = -ax1[0];
		info->m_J2angularAxis[srow+1] = -ax1[1];
		info->m_J2angularAxis[srow+2] = -ax1[2];

		btScalar lostop = getLowerLimit();
		btScalar histop = getUpperLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		info->m_constraintError[srow] = btScalar(0.0f);
		btScalar currERP = (m_flags & BT_HINGE_FLAGS_ERP_STOP) ? m_stopERP : normalErp;
		if(powered)
		{
			if(m_flags & BT_HINGE_FLAGS_CFM_NORM)
			{
				info->cfm[srow] = m_normalCFM;
			}
			btScalar mot_fact = getMotorFactor(m_hingeAngle, lostop, histop, m_motorTargetVelocity, info->fps * currERP);
			info->m_constraintError[srow] += mot_fact * m_motorTargetVelocity * m_referenceSign;
			info->m_lowerLimit[srow] = - m_maxMotorImpulse;
			info->m_upperLimit[srow] =   m_maxMotorImpulse;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_HINGE_FLAGS_CFM_STOP)
			{
				info->cfm[srow] = m_stopCFM;
			}
			if(lostop == histop) 
			{
				// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimAng) for that)
#ifdef	_BT_USE_CENTER_LIMIT_
			btScalar bounce = m_limit.getRelaxationFactor();
#else
			btScalar bounce = m_relaxationFactor;
#endif
			if(bounce > btScalar(0.0))
			{
				btScalar vel = angVelA.dot(ax1);
				vel -= angVelB.dot(ax1);
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if(newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{	// high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
#ifdef	_BT_USE_CENTER_LIMIT_
			info->m_constraintError[srow] *= m_limit.getBiasFactor();
#else
			info->m_constraintError[srow] *= m_biasFactor;
#endif
		} // if(limit)
	} // if angular limit or powered
}